

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall string_string_utf16_Test::TestBody(string_string_utf16_Test *this)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  ushort uVar4;
  pointer *__ptr;
  ushort uVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  AssertionResult gtest_ar_3;
  string empty;
  char16_t empty_data [1];
  utf16_buffer to_utf16;
  utf32_buffer unicode;
  string from_utf16;
  AssertHelper local_e8;
  AssertHelper local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  AssertHelper local_d0;
  undefined1 local_c8 [8];
  AssertHelperData *local_c0;
  char16_t local_a2;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_30;
  
  ST::string::from_utf16
            (&local_30,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff,
             check_validity);
  local_a0 = (undefined1  [8])0x1c;
  local_c8 = (undefined1  [8])local_30.m_buffer.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_70,"text_size(utf8_test_data)","from_utf16.size()",
             (unsigned_long *)local_a0,(unsigned_long *)local_c8);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x12f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  ST::utf8_to_utf32((utf32_buffer *)local_70,local_30.m_buffer.m_chars,local_30.m_buffer.m_size,
                    assume_valid);
  local_c8 = (undefined1  [8])((ulong)local_c8 & 0xffffffff00000000);
  iVar6 = *(int *)CONCAT71(local_70._1_7_,local_70[0]);
  local_e0.data_._0_4_ = 0x20;
  if (iVar6 == 0x20) {
    lVar7 = 4;
    do {
      if ((int)local_e0.data_ == 0) {
        local_e0.data_._0_4_ = 0;
        goto LAB_00137071;
      }
      local_e0.data_._0_4_ =
           *(int *)((long)L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff" + lVar7);
      iVar6 = *(int *)((long)CONCAT71(local_70._1_7_,local_70[0]) + lVar7);
      lVar7 = lVar7 + 4;
    } while ((int)local_e0.data_ == iVar6);
  }
  local_e0.data_._0_4_ = (int)local_e0.data_ - iVar6;
LAB_00137071:
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"0","T_strcmp(test_data, unicode.data())",(int *)local_c8,
             (int *)&local_e0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x131,pcVar8);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_c8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c8 + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  ST::string::from_utf32
            ((string *)local_c8,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff
             ,check_validity);
  ST::utf8_to_utf16((utf16_buffer *)local_a0,(char *)local_c8,(size_t)local_c0,assume_valid);
  if (((AssertHelperData *)&DAT_0000000f < local_c0) && (local_c8 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_c8);
  }
  local_e0.data_._0_4_ = 0;
  uVar4 = *(ushort *)local_a0;
  uVar3 = 0x20;
  if (uVar4 == 0x20) {
    uVar5 = 0x20;
    lVar7 = 2;
    do {
      if (uVar5 == 0) {
        local_e8.data_._0_4_ = 0;
        goto LAB_001371a5;
      }
      uVar5 = *(ushort *)((long)L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff" + lVar7);
      uVar4 = *(ushort *)((long)local_a0 + lVar7);
      lVar7 = lVar7 + 2;
    } while (uVar5 == uVar4);
    uVar3 = (uint)uVar5;
  }
  local_e8.data_._0_4_ = uVar3 - uVar4;
LAB_001371a5:
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_c8,"0","T_strcmp(utf16_test_data, to_utf16.data())",(int *)&local_e0,
             (int *)&local_e8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_c0 == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_c0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x135,pcVar8);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((long *)CONCAT44(local_e0.data_._4_4_,(int)local_e0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,(int)local_e0.data_) + 8))();
    }
  }
  if (local_c0 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
  }
  local_a2 = L'\0';
  ST::string::from_utf16((string *)local_c8,&local_a2,0xffffffffffffffff,check_validity);
  local_d0.data_._0_4_ = 0;
  local_e8.data_ = local_c0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_e0,"0U","empty.size()",(uint *)&local_d0,(unsigned_long *)&local_e8)
  ;
  if (local_e0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x13a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  local_e8.data_ = local_e8.data_ & 0xffffffff00000000;
  uVar2 = (undefined1)*(Type *)local_c8;
  local_d0.data_._0_4_ = 0;
  if (uVar2 == kSuccess) {
    lVar7 = 1;
    uVar2 = kSuccess;
    do {
      if (uVar2 == kSuccess) {
        local_d0.data_._0_4_ = 0;
        goto LAB_00137340;
      }
      uVar2 = *(char *)((long)(Type *)local_c8 + lVar7);
      lVar1 = lVar7 + 5;
      local_d0.data_._0_4_ = (int)"\txxx\t"[lVar1];
      lVar7 = lVar7 + 1;
    } while (uVar2 == "\txxx\t"[lVar1]);
  }
  local_d0.data_._0_4_ = (char)uVar2 - (int)local_d0.data_;
LAB_00137340:
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_e0,"0","T_strcmp(empty.c_str(), \"\")",(int *)&local_e8,
             (int *)&local_d0);
  if (local_e0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x13b,pcVar8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if (((AssertHelperData *)&DAT_0000000f < local_c0) && (local_c8 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_c8);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f < local_98
      ) && (local_a0 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_a0);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb < local_68) &&
     ((void *)CONCAT71(local_70._1_7_,local_70[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_70._1_7_,local_70[0]));
  }
  if (((AssertHelperData *)&DAT_0000000f < local_30.m_buffer.m_size) &&
     (local_30.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_30.m_buffer.m_chars);
  }
  return;
}

Assistant:

TEST(string, string_utf16)
{
    // From UTF-16 to ST::string
    ST::string from_utf16 = ST::string::from_utf16(utf16_test_data);
    EXPECT_EQ(text_size(utf8_test_data), from_utf16.size());
    ST::utf32_buffer unicode = from_utf16.to_utf32();
    EXPECT_EQ(0, T_strcmp(test_data, unicode.data()));

    // From ST::string to UTF-16
    ST::utf16_buffer to_utf16 = ST::string::from_utf32(test_data).to_utf16();
    EXPECT_EQ(0, T_strcmp(utf16_test_data, to_utf16.data()));

    // Empty string
    const char16_t empty_data[] = { 0 };
    ST::string empty = ST::string::from_utf16(empty_data);
    EXPECT_EQ(0U, empty.size());
    EXPECT_EQ(0, T_strcmp(empty.c_str(), ""));
}